

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O3

int32_t conv_code_phits2pdg(int32_t c)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  iVar1 = 0;
  uVar2 = -c;
  if (0 < c) {
    uVar2 = c;
  }
  if (c != 0) {
    if (uVar2 < 1000000) {
      return c;
    }
    if (uVar2 < 131000000) {
      uVar3 = uVar2 % 1000000;
      if (uVar3 < 0x1f5 && uVar2 / 1000000 <= uVar3) {
        iVar4 = uVar3 + (uVar2 / 1000000) * 1000;
        iVar1 = iVar4 * 10 + 1000000000;
        if (c < 0) {
          iVar1 = iVar4 * -10 + -1000000000;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int32_t conv_code_phits2pdg( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (!c)
    return 0;
  if (absc<1000000) {
    //Presumably PHITS use pdg codes directly for non-nuclei/ions
    return c;
  }
  //PHITS encode nucleis as Z*1000000+A
  long A = absc % 1000000;
  long Z = absc / 1000000;
  if (!Z||Z>130||A<Z||A>500)//Just picking max Z=130, A=500 as a quick sanity check - could tighten this!
    return 0;//impossible
  //PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
  //and I!=0 indicates exited nuclei. We only allow L=I=0 ions here.
  long abspdgcode = 10 * (A + 1000*(Z+100000));
  return (int32_t) ( c < 0 ? -abspdgcode : abspdgcode );
}